

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall
kj::_::ExclusiveJoinPromiseNode::Branch::Branch
          (Branch *this,ExclusiveJoinPromiseNode *joinNode,Own<kj::_::PromiseNode> *dependencyParam)

{
  Own<kj::_::PromiseNode> *other;
  PromiseNode *pPVar1;
  Own<kj::_::PromiseNode> *dependencyParam_local;
  ExclusiveJoinPromiseNode *joinNode_local;
  Branch *this_local;
  
  Event::Event(&this->super_Event);
  (this->super_Event)._vptr_Event = (_func_int **)&PTR_getInnerForTrace_007d88e0;
  this->joinNode = joinNode;
  other = mv<kj::Own<kj::_::PromiseNode>>(dependencyParam);
  Own<kj::_::PromiseNode>::Own(&this->dependency,other);
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->dependency);
  (*pPVar1->_vptr_PromiseNode[1])();
  pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->dependency);
  (**pPVar1->_vptr_PromiseNode)(pPVar1,this);
  return;
}

Assistant:

ExclusiveJoinPromiseNode::Branch::Branch(
    ExclusiveJoinPromiseNode& joinNode, Own<PromiseNode> dependencyParam)
    : joinNode(joinNode), dependency(kj::mv(dependencyParam)) {
  dependency->setSelfPointer(&dependency);
  dependency->onReady(this);
}